

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoxObjectiveFunction.cpp
# Opt level: O0

int __thiscall
OpenMD::BoxObjectiveFunction::setCoor
          (BoxObjectiveFunction *this,DynamicVector<double,_std::allocator<double>_> *x)

{
  double v1;
  _func_int **v3;
  double dVar1;
  const_reference pvVar2;
  Molecule *this_00;
  SnapshotManager *this_01;
  size_type __n;
  long in_RDI;
  RectMatrix<double,_3U,_3U> *m1;
  SimInfo *this_02;
  Mat3x3d Hmat;
  int index;
  RealType norm;
  Mat3x3d test;
  Mat3x3d y;
  Mat3x3d eps;
  Mat3x3d eta;
  Molecule *mol;
  MoleculeIterator miter;
  Vector3d delta;
  Vector3d posN;
  Vector3d posO;
  RectMatrix<double,_3U,_3U> *in_stack_fffffffffffffa98;
  SquareMatrix<double,_3> *in_stack_fffffffffffffaa0;
  Molecule *in_stack_fffffffffffffaa8;
  RectMatrix<double,_3U,_3U> *in_stack_fffffffffffffab0;
  MoleculeIterator *in_stack_fffffffffffffab8;
  Molecule *this_03;
  Mat3x3d *m;
  Snapshot *in_stack_fffffffffffffb30;
  int local_43c;
  RectMatrix<double,_3U,_3U> local_3f0 [2];
  RectMatrix<double,_3U,_3U> local_360 [3];
  RectMatrix<double,_3U,_3U> local_288;
  RectMatrix<double,_3U,_3U> local_240 [2];
  undefined4 local_1ac;
  MoleculeIterator *local_1a8;
  SquareMatrix3<double> local_b8;
  Molecule *local_70;
  _Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_> local_68 [12];
  int local_4;
  
  Vector3<double>::Vector3((Vector3<double> *)0x2d7f74);
  Vector3<double>::Vector3((Vector3<double> *)0x2d7f81);
  Vector3<double>::Vector3((Vector3<double> *)0x2d7f8e);
  std::_Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_>::_Rb_tree_iterator(local_68);
  m = (Mat3x3d *)0x0;
  SquareMatrix3<double>::SquareMatrix3
            ((SquareMatrix3<double> *)in_stack_fffffffffffffaa0,(double)in_stack_fffffffffffffa98);
  SquareMatrix3<double>::SquareMatrix3
            ((SquareMatrix3<double> *)in_stack_fffffffffffffaa0,(double)in_stack_fffffffffffffa98);
  SquareMatrix3<double>::SquareMatrix3
            ((SquareMatrix3<double> *)in_stack_fffffffffffffaa0,(double)in_stack_fffffffffffffa98);
  SquareMatrix3<double>::SquareMatrix3
            ((SquareMatrix3<double> *)in_stack_fffffffffffffaa0,(double)in_stack_fffffffffffffa98);
  pvVar2 = DynamicVector<double,_std::allocator<double>_>::operator[]
                     ((DynamicVector<double,_std::allocator<double>_> *)in_stack_fffffffffffffaa0,
                      (size_type)in_stack_fffffffffffffa98);
  v1 = *pvVar2;
  pvVar2 = DynamicVector<double,_std::allocator<double>_>::operator[]
                     ((DynamicVector<double,_std::allocator<double>_> *)in_stack_fffffffffffffaa0,
                      (size_type)in_stack_fffffffffffffa98);
  this_03 = (Molecule *)*pvVar2;
  this_00 = (Molecule *)
            DynamicVector<double,_std::allocator<double>_>::operator[]
                      ((DynamicVector<double,_std::allocator<double>_> *)in_stack_fffffffffffffaa0,
                       (size_type)in_stack_fffffffffffffa98);
  v3 = this_00->_vptr_Molecule;
  pvVar2 = DynamicVector<double,_std::allocator<double>_>::operator[]
                     ((DynamicVector<double,_std::allocator<double>_> *)in_stack_fffffffffffffaa0,
                      (size_type)in_stack_fffffffffffffa98);
  dVar1 = *pvVar2;
  pvVar2 = DynamicVector<double,_std::allocator<double>_>::operator[]
                     ((DynamicVector<double,_std::allocator<double>_> *)in_stack_fffffffffffffaa0,
                      (size_type)in_stack_fffffffffffffa98);
  m1 = (RectMatrix<double,_3U,_3U> *)(*pvVar2 * 0.5);
  pvVar2 = DynamicVector<double,_std::allocator<double>_>::operator[]
                     ((DynamicVector<double,_std::allocator<double>_> *)in_stack_fffffffffffffaa0,
                      (size_type)in_stack_fffffffffffffa98);
  SquareMatrix3<double>::setupVoigtTensor
            (&local_b8,v1,(double)this_03,(double)v3,dVar1 * 0.5,(double)m1,*pvVar2 * 0.5);
  this_02 = (SimInfo *)RectMatrix<double,_3U,_3U>::frobeniusNorm(in_stack_fffffffffffffab0);
  if ((double)this_02 <= 0.7) {
    local_1a8 = (MoleculeIterator *)0x3ff0000000000000;
    SquareMatrix3<double>::operator=
              ((SquareMatrix3<double> *)in_stack_fffffffffffffaa0,
               (SquareMatrix3<double> *)in_stack_fffffffffffffa98);
    while (1e-10 < (double)local_1a8) {
      OpenMD::operator*((SquareMatrix3<double> *)m1,(SquareMatrix3<double> *)this_02);
      operator/(m1,(double)this_02);
      OpenMD::operator-(m1,(RectMatrix<double,_3U,_3U> *)this_02);
      SquareMatrix<double,_3>::SquareMatrix(in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98);
      SquareMatrix3<double>::operator=
                ((SquareMatrix3<double> *)in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0);
      SquareMatrix<double,_3>::~SquareMatrix((SquareMatrix<double,_3> *)0x2d82b1);
      RectMatrix<double,_3U,_3U>::~RectMatrix(local_240);
      RectMatrix<double,_3U,_3U>::~RectMatrix(&local_288);
      SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x2d82d8);
      OpenMD::operator-(m1,(RectMatrix<double,_3U,_3U> *)this_02);
      SquareMatrix<double,_3>::SquareMatrix(in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98);
      SquareMatrix3<double>::operator=
                ((SquareMatrix3<double> *)in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0);
      SquareMatrix<double,_3>::~SquareMatrix((SquareMatrix<double,_3> *)0x2d8332);
      RectMatrix<double,_3U,_3U>::~RectMatrix(local_360);
      in_stack_fffffffffffffab8 =
           (MoleculeIterator *)RectMatrix<double,_3U,_3U>::frobeniusNorm(in_stack_fffffffffffffab0);
      local_1a8 = in_stack_fffffffffffffab8;
      SquareMatrix3<double>::operator=
                ((SquareMatrix3<double> *)in_stack_fffffffffffffaa0,
                 (SquareMatrix3<double> *)in_stack_fffffffffffffa98);
    }
    SquareMatrix<double,_3>::identity();
    OpenMD::operator+(m1,(RectMatrix<double,_3U,_3U> *)this_02);
    SquareMatrix<double,_3>::SquareMatrix(in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98);
    SquareMatrix3<double>::operator=
              ((SquareMatrix3<double> *)in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0);
    SquareMatrix<double,_3>::~SquareMatrix((SquareMatrix<double,_3> *)0x2d84c4);
    RectMatrix<double,_3U,_3U>::~RectMatrix(local_3f0);
    SquareMatrix<double,_3>::~SquareMatrix((SquareMatrix<double,_3> *)0x2d84de);
    local_43c = 0;
    local_70 = SimInfo::beginMolecule(this_02,in_stack_fffffffffffffab8);
    while (local_70 != (Molecule *)0x0) {
      __n = (size_type)local_43c;
      local_43c = local_43c + 1;
      std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::operator[]
                ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
                 (in_RDI + 0xd0),__n);
      Vector3<double>::operator=
                ((Vector3<double> *)in_stack_fffffffffffffaa0,
                 (Vector3<double> *)in_stack_fffffffffffffa98);
      Molecule::getCom(this_03);
      Vector3<double>::operator=
                ((Vector3<double> *)in_stack_fffffffffffffaa0,
                 (Vector3<double> *)in_stack_fffffffffffffa98);
      OpenMD::operator*(m1,(Vector<double,_3U> *)this_02);
      OpenMD::operator-((Vector<double,_3U> *)in_stack_fffffffffffffaa8,
                        (Vector<double,_3U> *)in_stack_fffffffffffffaa0);
      Vector3<double>::operator=
                ((Vector3<double> *)in_stack_fffffffffffffaa8,
                 (Vector<double,_3U> *)in_stack_fffffffffffffaa0);
      Molecule::moveCom(this_00,(Vector3d *)this_03);
      in_stack_fffffffffffffaa8 = SimInfo::nextMolecule(this_02,in_stack_fffffffffffffab8);
      local_70 = in_stack_fffffffffffffaa8;
    }
    OpenMD::operator*((SquareMatrix3<double> *)m1,(SquareMatrix3<double> *)this_02);
    this_01 = SimInfo::getSnapshotManager(*(SimInfo **)(in_RDI + 8));
    SnapshotManager::getCurrentSnapshot(this_01);
    Snapshot::setHmat(in_stack_fffffffffffffb30,m);
    local_4 = 0;
    local_1ac = 1;
    SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x2d871f);
  }
  else {
    local_4 = -1;
    local_1ac = 1;
  }
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x2d8751);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x2d875e);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x2d876b);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x2d8778);
  return local_4;
}

Assistant:

int BoxObjectiveFunction::setCoor(const DynamicVector<RealType>& x) {
    Vector3d posO;
    Vector3d posN;
    Vector3d delta;
    SimInfo::MoleculeIterator miter;
    Molecule* mol;
    Mat3x3d eta(0.0);
    Mat3x3d eps(0.0);
    Mat3x3d y(0.0);
    Mat3x3d test(0.0);
    RealType norm;

    // η is the Lagrangian strain tensor:
    eta.setupVoigtTensor(x[0], x[1], x[2], x[3] / 2., x[4] / 2., x[5] / 2.);

    // Make sure the deformation isn't too large:
    if (eta.frobeniusNorm() > 0.7) {
      // Deformation is too large, return an error condition:
      return -1;
    }

    // Find the physical strain tensor, ε, from the Lagrangian strain, η:
    // η = ε + 0.5 * ε^2
    norm = 1.0;
    eps  = eta;
    while (norm > 1.0e-10) {
      y    = eta - eps * eps / 2.0;
      test = y - eps;
      norm = test.frobeniusNorm();
      eps  = y;
    }
    deformation_ = SquareMatrix3<RealType>::identity() + eps;

    int index = 0;

    for (mol = info_->beginMolecule(miter); mol != NULL;
         mol = info_->nextMolecule(miter)) {
      posO  = refPos_[index++];
      posN  = mol->getCom();
      delta = deformation_ * posO - posN;
      mol->moveCom(delta);
    }

    Mat3x3d Hmat = deformation_ * refHmat_;
    info_->getSnapshotManager()->getCurrentSnapshot()->setHmat(Hmat);
    return 0;
  }